

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Cpu.cpp
# Opt level: O3

void __thiscall Kss_Cpu::Kss_Cpu(Kss_Cpu *this)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  this->state = &this->state_;
  lVar1 = 0x100;
  uVar2 = 0xff;
  do {
    bVar3 = 4;
    if (uVar2 != 0) {
      uVar4 = 1;
      uVar6 = uVar2 & 0xffffffff;
      do {
        uVar5 = (uint)uVar6;
        uVar4 = uVar4 ^ uVar5;
        uVar6 = (ulong)(uint)((int)uVar5 >> 1);
      } while (1 < uVar5);
      bVar3 = ((byte)uVar2 & 0xa8) + ((byte)uVar4 & 1) * '\x04';
    }
    this->szpc[uVar2] = bVar3;
    this->szpc[lVar1 + 0xff] = bVar3 | 1;
    lVar1 = lVar1 + -1;
    bVar7 = uVar2 != 0;
    uVar2 = uVar2 - 1;
  } while (bVar7);
  this->szpc[0] = this->szpc[0] | 0x40;
  this->szpc[0x100] = this->szpc[0x100] | 0x40;
  return;
}

Assistant:

Kss_Cpu::Kss_Cpu()
{
	state = &state_;
	
	for ( int i = 0x100; --i >= 0; )
	{
		int even = 1;
		for ( int p = i; p; p >>= 1 )
			even ^= p;
		int n = (i & (S80 | F20 | F08)) | ((even & 1) * P04);
		szpc [i] = n;
		szpc [i + 0x100] = n | C01;
	}
	szpc [0x000] |= Z40;
	szpc [0x100] |= Z40;
}